

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool __thiscall QMainWindowLayoutState::contains(QMainWindowLayoutState *this,QWidget *widget)

{
  QLayoutItem *pQVar1;
  qsizetype qVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  bool bVar4;
  QList<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->dockAreaLayout).centralWidgetItem;
  if (pQVar1 != (QLayoutItem *)0x0) {
    iVar3 = (*pQVar1->_vptr_QLayoutItem[0xd])();
    if ((QWidget *)CONCAT44(extraout_var,iVar3) == widget) {
      bVar4 = true;
      goto LAB_0042fdc7;
    }
  }
  QDockAreaLayout::indexOf(&local_40,&this->dockAreaLayout,widget);
  qVar2 = local_40.d.size;
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,4,0x10);
    }
  }
  bVar4 = true;
  if (qVar2 == 0) {
    QToolBarAreaLayout::indexOf(&local_40,&this->toolBarAreaLayout,widget);
    bVar4 = local_40.d.size != 0;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
LAB_0042fdc7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::contains(QWidget *widget) const
{
#if QT_CONFIG(dockwidget)
    if (dockAreaLayout.centralWidgetItem != nullptr && dockAreaLayout.centralWidgetItem->widget() == widget)
        return true;
    if (!dockAreaLayout.indexOf(widget).isEmpty())
        return true;
#else
    if (centralWidgetItem && centralWidgetItem->widget() == widget)
        return true;
#endif

#if QT_CONFIG(toolbar)
    if (!toolBarAreaLayout.indexOf(widget).isEmpty())
        return true;
#endif
    return false;
}